

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_evaluate_nurbs.cpp
# Opt level: O0

bool ON_EvaluateNurbsDeBoor
               (int cv_dim,int order,int cv_stride,double *cv,double *knots,int side,double mult_k,
               double t)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double dVar7;
  int local_150;
  int cv_inc;
  int k;
  int j;
  int i;
  int degree;
  double *k1;
  double *k0;
  double *cv1;
  double *cv0;
  double *free_delta_t;
  double *delta_t;
  double dt;
  double t1;
  double t0;
  double alpha1;
  double alpha0;
  double workarray [21];
  double t_local;
  double mult_k_local;
  int side_local;
  double *knots_local;
  double *cv_local;
  int cv_stride_local;
  int order_local;
  int cv_dim_local;
  
  iVar1 = cv_stride - cv_dim;
  free_delta_t = &alpha0;
  cv0 = (double *)0x0;
  iVar2 = order + -1;
  t1 = knots[order + -2];
  dt = knots[iVar2];
  workarray[0x14] = t;
  if ((t1 != dt) || (NAN(t1) || NAN(dt))) {
    local_150 = iVar2;
    if (side < 0) {
      if (t == dt) {
        if ((dt == knots[iVar2 * 2 + -1]) && (!NAN(dt) && !NAN(knots[iVar2 * 2 + -1]))) {
          return true;
        }
      }
      if (side == -2) {
        mult_k_local._4_4_ = -2;
        t1 = mult_k;
      }
      else if ((t1 != *knots) || (NAN(t1) || NAN(*knots))) {
        mult_k_local._4_4_ = -1;
        if (0x15 < iVar2) {
          cv0 = (double *)onmalloc((long)iVar2 << 3);
          free_delta_t = cv0;
        }
      }
      else {
        mult_k_local._4_4_ = -2;
      }
      pdVar3 = knots + (order + -2);
      k1 = pdVar3;
      if (mult_k_local._4_4_ == -2) {
        local_150 = order;
        while (local_150 = local_150 + -1, local_150 != 0) {
          cv1 = cv + order * cv_stride + -(long)cv_stride;
          k = local_150;
          _i = pdVar3 + local_150;
          k0 = cv + order * cv_stride;
          while (iVar2 = k + -1, k != 0) {
            pdVar4 = _i + -1;
            dVar7 = (workarray[0x14] - t1) / (*_i - t1);
            cv1 = cv1 + -(long)iVar1;
            k0 = k0 + -(long)iVar1;
            cv_inc = cv_dim;
            while (k = iVar2, _i = pdVar4, cv_inc != 0) {
              cv1 = cv1 + -1;
              k0 = k0 + -1;
              *k0 = *cv1 * (1.0 - dVar7) + *k0 * dVar7;
              cv_inc = cv_inc + -1;
            }
          }
        }
      }
      else {
        while (local_150 != 0) {
          *free_delta_t = workarray[0x14] - *k1;
          local_150 = local_150 + -1;
          k1 = k1 + -1;
          free_delta_t = free_delta_t + 1;
        }
        free_delta_t = free_delta_t + -(long)iVar2;
        local_150 = order;
        while (local_150 = local_150 + -1, local_150 != 0) {
          cv1 = cv + order * cv_stride + -(long)cv_stride;
          k = local_150;
          _i = pdVar3 + local_150;
          k1 = pdVar3;
          k0 = cv + order * cv_stride;
          while (iVar2 = k + -1, k != 0) {
            pdVar4 = free_delta_t + 1;
            pdVar5 = _i + -1;
            pdVar6 = k1 + -1;
            dVar7 = *free_delta_t / (*_i - *k1);
            cv1 = cv1 + -(long)iVar1;
            k0 = k0 + -(long)iVar1;
            cv_inc = cv_dim;
            while (k = iVar2, _i = pdVar5, k1 = pdVar6, free_delta_t = pdVar4, cv_inc != 0) {
              cv1 = cv1 + -1;
              k0 = k0 + -1;
              *k0 = *cv1 * (1.0 - dVar7) + *k0 * dVar7;
              cv_inc = cv_inc + -1;
            }
          }
          free_delta_t = free_delta_t + -(long)local_150;
        }
      }
    }
    else {
      if (t == t1) {
        if ((t1 == *knots) && (!NAN(t1) && !NAN(*knots))) {
          return true;
        }
      }
      if (side == 2) {
        mult_k_local._4_4_ = 2;
        dt = mult_k;
      }
      else if ((dt != knots[iVar2 * 2 + -1]) || (NAN(dt) || NAN(knots[iVar2 * 2 + -1]))) {
        mult_k_local._4_4_ = 1;
        if (0x15 < iVar2) {
          cv0 = (double *)onmalloc((long)iVar2 << 3);
          free_delta_t = cv0;
        }
      }
      else {
        mult_k_local._4_4_ = 2;
      }
      pdVar3 = knots + iVar2;
      _i = pdVar3;
      if (mult_k_local._4_4_ == 1) {
        while (local_150 != 0) {
          *free_delta_t = *_i - workarray[0x14];
          local_150 = local_150 + -1;
          _i = _i + 1;
          free_delta_t = free_delta_t + 1;
        }
        free_delta_t = free_delta_t + -(long)iVar2;
        local_150 = order;
        while (local_150 = local_150 + -1, local_150 != 0) {
          k0 = cv + cv_stride;
          k = local_150;
          _i = pdVar3;
          k1 = pdVar3 + -(long)local_150;
          cv1 = cv;
          while (k != 0) {
            dVar7 = *free_delta_t / (*_i - *k1);
            cv_inc = cv_dim;
            while (cv_inc != 0) {
              *cv1 = *cv1 * dVar7 + *k0 * (1.0 - dVar7);
              cv1 = cv1 + 1;
              k0 = k0 + 1;
              cv_inc = cv_inc + -1;
            }
            cv1 = cv1 + iVar1;
            k0 = k0 + iVar1;
            k = k + -1;
            _i = _i + 1;
            k1 = k1 + 1;
            free_delta_t = free_delta_t + 1;
          }
          free_delta_t = free_delta_t + -(long)local_150;
        }
      }
      else {
        local_150 = order;
        while (local_150 = local_150 + -1, local_150 != 0) {
          k0 = cv + cv_stride;
          k = local_150;
          k1 = pdVar3 + -(long)local_150;
          cv1 = cv;
          while (k != 0) {
            dVar7 = (dt - workarray[0x14]) / (dt - *k1);
            cv_inc = cv_dim;
            while (cv_inc != 0) {
              *cv1 = *cv1 * dVar7 + *k0 * (1.0 - dVar7);
              cv1 = cv1 + 1;
              k0 = k0 + 1;
              cv_inc = cv_inc + -1;
            }
            cv1 = cv1 + iVar1;
            k0 = k0 + iVar1;
            k = k + -1;
            k1 = k1 + 1;
          }
        }
      }
    }
    if (cv0 != (double *)0x0) {
      onfree(cv0);
    }
    order_local._3_1_ = true;
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_evaluate_nurbs.cpp"
               ,0x571,"","ON_EvaluateNurbsDeBoor(): knots[degree-1] == knots[degree]");
    order_local._3_1_ = false;
  }
  return order_local._3_1_;
}

Assistant:

bool ON_EvaluateNurbsDeBoor(
                           int cv_dim,
                           int order, 
                           int cv_stride,
                           double *cv,
                           const double *knots, 
                           int side,
                           double mult_k, 
                           double t
                           )
/*
 * Evaluate a B-spline span using the de Boor algorithm
 *
 * INPUT:
 *   cv_dim
 *      >= 1
 *   order
 *      (>= 2)  There is no restriction on order.  For order >= 18,
 *      the necessary workspace is dynamically allocated and deallocated.
 *      (The function requires a workspace of 2*order-2 doubles.)
 *   cv
 *      array of order*cv_dim doubles that specify the B-spline span's
 *      control vertices.
 *   knots
 *      array of 2*(order-1) doubles that specify the B-spline span's
 *      knot vector.
 *   side
 *      -1  return left side of B-spline span in cv array
 *      +1  return right side of B-spline span in cv array
 *      -2  return left side of B-spline span in cv array
 *          Ignore values of knots[0,...,order-3] and assume
 *          left end of span has a fully multiple knot with
 *          value "mult_k".
 *      +2  return right side of B-spline span in cv array
 *          Ignore values of knots[order,...,2*order-2] and
 *          assume right end of span has a fully multiple
 *          knot with value "mult_k".
 *      WARNING: If side is != {-2,-1,+1,+2}, this function may crash
 *               or return garbage.
 *   mult_k
 *      Used when side = -2 or +2.
 *   t 
 *      If side < 0, then the cv's for the portion of the NURB span to
 *      the LEFT of t are computed.  If side > 0, then the cv's for the
 *      portion the span to the RIGHT of t are computed.  The following
 *      table summarizes the restrictions on t:
 *
 *       value of side         condition t must satisfy
 *          -2                    mult_k < t and mult_k < knots[order-1]
 *          -1                    knots[order-2] < t
 *          +1                    t < knots[order-1]
 *          +2                    t < mult_k and knots[order-2] < mult_k
 *
 * OUTPUT:
 *   cv
 *      If side <= 0, the input cv's are replaced with the cv's for
 *      the B-spline span trimmed/extended to [knots[order-2],t]  with
 *      new knot vector {knots[0], ..., knots[order-2], t, ..., t}.
 *                                                      \________/
 *                                                       order-1 t's
 *      In particular, {cv[(order-1)*cv_dim], ..., cv[order*cv_dim - 1]}
 *      is the value of the B-spline at t.
 *      If side > 0, the input cv's are replaced with the cv's for
 *      the B-spline span trimmed/extended to [t,knots[order-1]]  with
 *      new knot vector {t, ..., t, knots[order-1], ..., knots[2*order-3]}.
 *                       \________/
 *                       order-1 t's
 *      In particular, {cv[0], ..., cv[cv_dim-1]} is the value of the B-spline
 *      at t.
 *
 *      NOTE WELL: The input knot vector is NOT modified.  If you want to
 *                 use the returned control points with the input knot vector,
 *                 then it is your responsibility to set
 *                    knots[0] = ... = knots[order-2] = t (side > 0)
 *                 or
 *                    knots[order-1] = ... = knots[2*order-2] = t (side < 0).
 *                 See the comments concering +/- 2 values of the "side"
 *                 argument.  In most cases, you can avoid resetting knots
 *                 by carefully choosing the value of "side" and "mult_k".
 *  TL_EvDeBoor()
 *   true: successful
 *   false: knot[order-2] == knot[order-1]
 *
 * COMMENTS:
 *
 *   This function is the single most important NURB curve function in the
 *   TL library.  It is used to evaluate, trim, split and extend NURB curves.
 *   It is used to convert portions of NURB curves to Beziers and to create
 *   fully multiple end knots.  The functions that perform the above tasks
 *   simply call this function with appropriate values and take linear
 *   combinations of the returned cv's to compute the desired result.
 *
 *   Rational cases are handled adding one to the dimension and applying the
 *   quotient rule as needed.
 *
 *   Set a[i,j] = (t-knots[i+j-1])/(knots[i+j+order-2] - knots[i+j-1])
 *   Set D[i,j] = {cv[j*cv_dim], ..., cv[(j+1)*cv_dim-1]}, if i = 0
 *                (1-a[i,j])*D[i-1,j-1] + a[i,j]*D[i-1,j], if 0 < i <= d = degree
 * 
 *   The collection of D[i,j]'s is typically drawn in a triangular array:
 *
 *   D[0,0]
 *            D[1,1]
 *   D[0,1]              D[2,2]
 *            D[1,2]             ...
 *   D[0,2]
 *  
 *   ...                                  D[d,d]
 *                               ...
 *   D[0,d-1]            D[2,d]
 *            D[1,d]
 *   D[0,d]
 *
 *   When side <= 0, the input cv's are replaced with
 *   D[0,0], D[1,2], ..., D[d,d].
 *
 *   When side >  0, the input cv's are replace with
 *   D[d,d], D[d-1,d], ..., D[0,d].
 *
 * EXAMPLE:
 *
 * REFERENCE:
 *   BOHM-01, Page 16.
 *   LEE-01, Section 6.
 *
 * RELATED FUNCTIONS:
 *   TL_EvNurbBasis(), TL_EvNurb(), TL_EvdeCasteljau(), TL_EvQuotientRule()
 */
{
  double 
    workarray[21], alpha0, alpha1, t0, t1, dt, *delta_t, *free_delta_t, *cv0, *cv1;
  const double 
    *k0, *k1;
  int
    degree, i, j, k;

  const int cv_inc = cv_stride - cv_dim;

  j = 0;
  delta_t = workarray;
  free_delta_t = 0;
  degree = order-1;  
  t0 = knots[degree-1];
  t1 = knots[degree];
  if (t0 == t1) {
    ON_ERROR("ON_EvaluateNurbsDeBoor(): knots[degree-1] == knots[degree]");
    return false;
  }

  if (side < 0) {
    /* if right end of span is fully multiple and t = end knot,
     * then we're done.
     */
    if (t == t1 && t1 == knots[2*degree-1])
      return true;
    /* if left end of span is fully multiple, save time */
    if (side == -2)
      t0 = mult_k;
    else if (t0 == knots[0])
      side = -2;
    else {
      side = -1;
      if (degree > 21)
        delta_t = free_delta_t = (double*)onmalloc(degree*sizeof(*delta_t));
    }
    /* delta_t = {t - knot[order-2], t - knot[order-1], ... , t - knot[0]} */
    knots += degree-1;
    if (side != -2) {
      k0=knots; k=degree; while(k--) *delta_t++ = t - *k0--; delta_t -= degree;
      cv += order*cv_stride;
      k = order; while (--k) { 
        cv1 = cv;
        cv0 = cv1 - cv_stride;
        k0 = knots;             /* *k0 = input_knots[d-1]          */
        k1 = k0+k;              /* *k1 = input_knots[d-1+k]        */ 
        i = k; while(i--) {
          alpha1 = *delta_t++/(*k1-- - *k0--); 
          alpha0 = 1.0 - alpha1;
          cv0 -= cv_inc;
          cv1 -= cv_inc;
          j = cv_dim;
          while (j--) {cv0--; cv1--; *cv1 = *cv0 * alpha0 + *cv1 * alpha1;} 
        }
        delta_t -= k;
      }
    }
    else {
      dt = t - t0;
      // cv += order*cv_dim; // Chuck-n-Dale 21 Sep bug fix change cv_dim to cv_stride
      cv += order*cv_stride;
      k = order; while (--k) { 
        cv1 = cv;
        cv0 = cv1 - cv_stride;
        k1 = knots+k;
        i = k; while(i--) {
          alpha1 = dt/(*k1-- - t0); 
          alpha0 = 1.0 - alpha1;
          cv0 -= cv_inc;
          cv1 -= cv_inc;
          j = cv_dim;
          while (j--) {cv0--; cv1--; *cv1 = *cv0 * alpha0 + *cv1 * alpha1;} 
        }
      }
    }
  }
  else {
    /* if left end of span is fully multiple and t = start knot,
     * then we're done.
     */
    if (t == t0 && t0 == knots[0])
      return true;
    /* if right end of span is fully multiple, save time */
    if (side == 2)
      t1 = mult_k;
    else if (t1 == knots[2*degree-1])
      side = 2;
    else {
      side = 1;
      if (degree > 21)
        delta_t = free_delta_t = (double*)onmalloc(degree*sizeof(*delta_t));
    }
    knots += degree;
    if (side == 1) {
      /* variable right end knots
       * delta_t = {knot[order-1] - t, knot[order] -  t, .. knot[2*order-3] - t}
       */
      k1=knots; k = degree; while (k--) *delta_t++ = *k1++ - t; delta_t -= degree;
      k = order; while (--k) {
        cv0 = cv;
        cv1 = cv0 + cv_stride;
        k1 = knots;
        k0 = k1 - k;
        i = k; while(i--) {
          alpha0 = *delta_t++/(*k1++ - *k0++);
          alpha1 = 1.0 - alpha0;
          j = cv_dim;
          while(j--) {*cv0 = *cv0 * alpha0 + *cv1 * alpha1; cv0++; cv1++;}
          cv0 += cv_inc;
          cv1 += cv_inc;
        }
        delta_t -= k;
      }
    }
    else {
      /* all right end knots = t1  delta_t = t1 - t */
      dt = t1 - t;
      k = order; while (--k) {
        cv0 = cv;
        cv1 = cv0 + cv_stride;
        k0 = knots - k;         /* *knots = input_knots[d]       */ 
        i = k; while(i--) {
          alpha0 = dt/(t1 - *k0++);
          alpha1 = 1.0 - alpha0;
          j = cv_dim;
          while(j--) {*cv0 = *cv0 * alpha0 + *cv1 * alpha1; cv0++; cv1++;}
          cv0 += cv_inc;
          cv1 += cv_inc;
        }
      }
    }
  }
    
  if (free_delta_t)
    onfree(free_delta_t);

  return true;
}